

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhp.cpp
# Opt level: O3

void cds::gc::dhp::smr::destruct(bool bDetachAll)

{
  if (instance_ != (smr *)0x0) {
    if (bDetachAll) {
      detach_all_thread(instance_);
    }
    ~smr(instance_);
    (*(code *)(anonymous_namespace)::s_free_memory)(instance_);
    instance_ = (smr *)0x0;
  }
  return;
}

Assistant:

CDS_EXPORT_API void smr::destruct( bool bDetachAll )
    {
        if ( instance_ ) {
            if ( bDetachAll )
                instance_->detach_all_thread();

            instance_->~smr();
            s_free_memory( instance_ );
            instance_ = nullptr;
        }
    }